

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<Image,_std::allocator<Image>_> *
getContainerImages(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *rootDir)

{
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  *p_Var1;
  path *this;
  char *__s;
  uintmax_t uVar2;
  undefined1 local_200 [8];
  stat attr;
  element_type *peStack_168;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_160;
  string local_150;
  string local_130;
  string local_110 [8];
  string imageId;
  undefined1 local_d0 [72];
  undefined1 local_88 [8];
  string lastModified;
  undefined1 auStack_58 [8];
  recursive_directory_iterator __begin1;
  recursive_directory_iterator __end1;
  
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 rootDir,"/images");
  std::filesystem::__cxx11::path::path((path *)local_200,(string_type *)local_d0,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)((long)&lastModified.field_2 + 8),(path *)local_200);
  std::filesystem::__cxx11::path::~path((path *)local_200);
  std::__cxx11::string::~string((string *)local_d0);
  p_Var1 = (__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
            *)((long)&lastModified.field_2 + 8);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
                  *)(attr.__glibc_reserved + 2),p_Var1);
  auStack_58 = (undefined1  [8])attr.__glibc_reserved[2];
  __begin1._M_dirs._M_ptr = peStack_168;
  attr.__glibc_reserved[2] = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)(attr.__glibc_reserved + 2));
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_160,p_Var1);
  __begin1._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_160);
  while (__begin1._M_dirs._M_ptr != (element_type *)0x0) {
    this = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                             ((recursive_directory_iterator *)auStack_58);
    std::filesystem::__cxx11::path::filename((path *)local_200,this);
    std::__cxx11::string::string((string *)(imageId.field_2._M_local_buf + 8),(string *)local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,".",(allocator<char> *)local_88);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_d0,(string *)((long)&imageId.field_2 + 8),&local_130);
    std::__cxx11::string::string(local_110,(string *)local_d0._0_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)(imageId.field_2._M_local_buf + 8));
    std::filesystem::__cxx11::path::~path((path *)local_200);
    memset((stat *)local_200,0,0x90);
    stat((this->_M_pathname)._M_dataplus._M_p,(stat *)local_200);
    __s = ctime(&attr.st_atim.tv_nsec);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,__s,(allocator<char> *)local_d0);
    trimEnd((string *)local_88,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    uVar2 = std::filesystem::file_size(this);
    std::__cxx11::string::string((string *)local_d0,local_110);
    local_d0._32_8_ = uVar2;
    std::__cxx11::string::string((string *)(local_d0 + 0x28),(string *)local_88);
    std::vector<Image,_std::allocator<Image>_>::emplace_back<Image>
              (__return_storage_ptr__,(Image *)local_d0);
    Image::~Image((Image *)local_d0);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string(local_110);
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)auStack_58);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&__begin1._M_dirs._M_refcount);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)auStack_58);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)((long)&lastModified.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> getContainerImages(const std::string& rootDir)
{
    std::vector<Image> images;
    for (const auto& archive : std::filesystem::recursive_directory_iterator(rootDir + "/images"))
    {
        std::string imageId = split(archive.path().filename(), ".")[0];
        // Obtains the time at which the file was last modified
        struct stat attr{};
        stat(archive.path().c_str(), &attr);
        std::string lastModified(trimEnd(ctime(&attr.st_mtime)));

        uintmax_t fileSize = std::filesystem::file_size(archive);
        images.emplace_back(Image { imageId, fileSize, lastModified });
    }
    return images;
}